

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromDecimalString
          (IEEEFloat *this,StringRef str,roundingMode rounding_mode)

{
  fltSemantics *pfVar1;
  bool bVar2;
  uint uVar3;
  byte bVar4;
  opStatus oVar5;
  byte *pbVar6;
  WordType *dst;
  int iVar7;
  WordType carry;
  byte *pbVar8;
  ulong multiplier;
  int iVar9;
  int iVar10;
  int iVar11;
  byte *pbVar12;
  byte bVar13;
  uint uVar14;
  uint exp;
  byte *pbVar15;
  byte *begin;
  byte *end;
  byte *local_40;
  IEEEFloat *local_38;
  
  begin = (byte *)str.Data;
  end = begin + str.Length;
  local_40 = end;
  pbVar6 = (byte *)skipLeadingZeroesAndAnyDot((iterator)begin,(iterator)end,(iterator *)&local_40);
  pbVar15 = local_40;
  pbVar12 = pbVar6;
  while (pbVar8 = pbVar12, pbVar12 != end) {
    bVar4 = *pbVar12;
    if (bVar4 == 0x2e) {
      if (pbVar15 != end) {
        __assert_fail("dot == end && \"String contains multiple dots\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x155,
                      "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                     );
      }
      pbVar8 = pbVar12 + 1;
      pbVar15 = pbVar12;
      local_40 = pbVar12;
      if (pbVar8 == end) break;
      bVar4 = *pbVar8;
    }
    if ((int)(char)bVar4 - 0x3aU < 0xfffffff6) goto LAB_0017aed5;
    pbVar12 = pbVar8 + 1;
  }
  if (pbVar8 == end) {
    exp = 0;
  }
  else {
    bVar4 = *pbVar8;
LAB_0017aed5:
    if ((bVar4 | 0x20) != 0x65) {
      __assert_fail("(*p == \'e\' || *p == \'E\') && \"Invalid character in significand\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x15f,
                    "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                   );
    }
    if (pbVar8 == begin) {
      __assert_fail("p != begin && \"Significand has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x160,
                    "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                   );
    }
    if ((pbVar15 != end) && ((long)pbVar8 - (long)begin == 1)) {
      __assert_fail("(dot == end || p - begin != 1) && \"Significand has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x161,
                    "void llvm::interpretDecimal(StringRef::iterator, StringRef::iterator, decimalInfo *)"
                   );
    }
    pbVar12 = pbVar8 + 1;
    if (pbVar12 == end) {
      __assert_fail("p != end && \"Exponent has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xca,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
    }
    bVar4 = *pbVar12;
    if ((bVar4 == 0x2d) || (bVar13 = bVar4, bVar4 == 0x2b)) {
      pbVar12 = pbVar8 + 2;
      if (pbVar12 == end) {
        __assert_fail("p != end && \"Exponent has no digits\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xcf,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
      }
      bVar13 = *pbVar12;
    }
    uVar14 = (int)(char)bVar13 - 0x30;
    if (9 < uVar14) {
      __assert_fail("absExponent < 10U && \"Invalid character in exponent\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xd3,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
    }
    do {
      pbVar12 = pbVar12 + 1;
      if (pbVar12 == end) goto LAB_0017af80;
      if (9 < (int)(char)*pbVar12 - 0x30U) {
        __assert_fail("value < 10U && \"Invalid character in exponent\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xd9,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
      }
      bVar2 = uVar14 < 24000;
      uVar14 = ((int)(char)*pbVar12 - 0x30U) + uVar14 * 10;
    } while (bVar2);
    uVar14 = 24000;
LAB_0017af80:
    exp = -uVar14;
    if (bVar4 != 0x2d) {
      exp = uVar14;
    }
    if (pbVar15 == end) {
      pbVar15 = pbVar8;
      local_40 = pbVar8;
    }
  }
  if (pbVar8 == pbVar6) {
    iVar7 = 0;
    pbVar12 = pbVar6;
  }
  else {
    pbVar12 = begin;
    if (pbVar8 != begin) {
      do {
        pbVar8 = pbVar8 + -1;
        pbVar12 = begin;
        if (pbVar8 == begin) break;
      } while ((*pbVar8 == 0x30) || (pbVar12 = pbVar8, *pbVar8 == 0x2e));
    }
    exp = exp + (int)(short)(((short)pbVar15 - (short)pbVar12) - (ushort)(pbVar12 < pbVar15));
    iVar7 = (int)(short)(((short)pbVar12 - (short)pbVar6) -
                        (ushort)(pbVar6 < pbVar15 && pbVar15 < pbVar12)) + exp;
  }
  if ((pbVar6 == end) || ((int)(char)*pbVar6 - 0x3aU < 0xfffffff6)) {
    this->field_0x12 = this->field_0x12 & 0xf8 | 3;
    return opOK;
  }
  if (iVar7 < 0xc78d) {
    if (-0xc78b < iVar7) {
      iVar9 = iVar7 * 0x7042 + 0x7042;
      pfVar1 = this->semantics;
      iVar10 = (int)pfVar1->minExponent - pfVar1->precision;
      iVar11 = iVar10 * 0x21cb;
      if (iVar9 != iVar11 && SBORROW4(iVar9,iVar11) == iVar9 + iVar10 * -0x21cb < 0) {
        iVar7 = iVar7 * 0xa437 + -0xa437;
        if (SBORROW4(iVar7,pfVar1->maxExponent * 0x316f) !=
            iVar7 + pfVar1->maxExponent * -0x316f < 0) {
          uVar14 = 0;
          local_38 = this;
          dst = (WordType *)
                operator_new__((ulong)(((((int)pbVar12 - (int)pbVar6) * 0xc4 + 0xc4U) / 0x3b + 0x40
                                        >> 3 & 0x1fffff8) + 8));
LAB_0017b0ef:
          carry = 0;
          multiplier = 1;
          do {
            bVar4 = *begin;
            pbVar15 = begin;
            if (bVar4 == 0x2e) {
              pbVar15 = begin + 1;
              begin = end;
              if (pbVar15 == end) goto LAB_0017b138;
              bVar4 = *pbVar15;
            }
            if (9 < (int)(char)bVar4 - 0x30U) {
              __assert_fail("decValue < 10U && \"Invalid character in significand\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                            ,0x9dc,
                            "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromDecimalString(StringRef, roundingMode)"
                           );
            }
            begin = pbVar15 + 1;
            multiplier = multiplier * 10;
            carry = carry * 10 + (ulong)((int)(char)bVar4 - 0x30U);
            if ((pbVar12 < begin) || (0x1999999999999998 < multiplier)) goto LAB_0017b138;
          } while( true );
        }
        goto LAB_0017b03f;
      }
    }
    this->field_0x12 = this->field_0x12 & 0xf8 | 2;
    zeroSignificand(this);
    oVar5 = normalize(this,rounding_mode,lfLessThanHalf);
    return oVar5;
  }
LAB_0017b03f:
  oVar5 = handleOverflow(this,rounding_mode);
  return oVar5;
LAB_0017b138:
  APInt::tcMultiplyPart(dst,dst,multiplier,carry,uVar14,uVar14 + 1,false);
  uVar3 = uVar14 + 1;
  if (dst[uVar14] == 0) {
    uVar3 = uVar14;
  }
  uVar14 = uVar3;
  if (pbVar12 < begin) {
    local_38->field_0x12 = local_38->field_0x12 & 0xf8 | 2;
    oVar5 = roundSignificandWithExponent(local_38,dst,uVar14,exp,rounding_mode);
    operator_delete__(dst);
    return oVar5;
  }
  goto LAB_0017b0ef;
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::convertFromDecimalString(StringRef str, roundingMode rounding_mode) {
  decimalInfo D;
  opStatus fs;

  /* Scan the text.  */
  StringRef::iterator p = str.begin();
  interpretDecimal(p, str.end(), &D);

  /* Handle the quick cases.  First the case of no significant digits,
     i.e. zero, and then exponents that are obviously too large or too
     small.  Writing L for log 10 / log 2, a number d.ddddd*10^exp
     definitely overflows if

           (exp - 1) * L >= maxExponent

     and definitely underflows to zero where

           (exp + 1) * L <= minExponent - precision

     With integer arithmetic the tightest bounds for L are

           93/28 < L < 196/59            [ numerator <= 256 ]
           42039/12655 < L < 28738/8651  [ numerator <= 65536 ]
  */

  // Test if we have a zero number allowing for strings with no null terminators
  // and zero decimals with non-zero exponents.
  //
  // We computed firstSigDigit by ignoring all zeros and dots. Thus if
  // D->firstSigDigit equals str.end(), every digit must be a zero and there can
  // be at most one dot. On the other hand, if we have a zero with a non-zero
  // exponent, then we know that D.firstSigDigit will be non-numeric.
  if (D.firstSigDigit == str.end() || decDigitValue(*D.firstSigDigit) >= 10U) {
    category = fcZero;
    fs = opOK;

  /* Check whether the normalized exponent is high enough to overflow
     max during the log-rebasing in the max-exponent check below. */
  } else if (D.normalizedExponent - 1 > INT_MAX / 42039) {
    fs = handleOverflow(rounding_mode);

  /* If it wasn't, then it also wasn't high enough to overflow max
     during the log-rebasing in the min-exponent check.  Check that it
     won't overflow min in either check, then perform the min-exponent
     check. */
  } else if (D.normalizedExponent - 1 < INT_MIN / 42039 ||
             (D.normalizedExponent + 1) * 28738 <=
               8651 * (semantics->minExponent - (int) semantics->precision)) {
    /* Underflow to zero and round.  */
    category = fcNormal;
    zeroSignificand();
    fs = normalize(rounding_mode, lfLessThanHalf);

  /* We can finally safely perform the max-exponent check. */
  } else if ((D.normalizedExponent - 1) * 42039
             >= 12655 * semantics->maxExponent) {
    /* Overflow and round.  */
    fs = handleOverflow(rounding_mode);
  } else {
    integerPart *decSignificand;
    unsigned int partCount;

    /* A tight upper bound on number of bits required to hold an
       N-digit decimal integer is N * 196 / 59.  Allocate enough space
       to hold the full significand, and an extra part required by
       tcMultiplyPart.  */
    partCount = static_cast<unsigned int>(D.lastSigDigit - D.firstSigDigit) + 1;
    partCount = partCountForBits(1 + 196 * partCount / 59);
    decSignificand = new integerPart[partCount + 1];
    partCount = 0;

    /* Convert to binary efficiently - we do almost all multiplication
       in an integerPart.  When this would overflow do we do a single
       bignum multiplication, and then revert again to multiplication
       in an integerPart.  */
    do {
      integerPart decValue, val, multiplier;

      val = 0;
      multiplier = 1;

      do {
        if (*p == '.') {
          p++;
          if (p == str.end()) {
            break;
          }
        }
        decValue = decDigitValue(*p++);
        assert(decValue < 10U && "Invalid character in significand");
        multiplier *= 10;
        val = val * 10 + decValue;
        /* The maximum number that can be multiplied by ten with any
           digit added without overflowing an integerPart.  */
      } while (p <= D.lastSigDigit && multiplier <= (~ (integerPart) 0 - 9) / 10);

      /* Multiply out the current part.  */
      APInt::tcMultiplyPart(decSignificand, decSignificand, multiplier, val,
                            partCount, partCount + 1, false);

      /* If we used another part (likely but not guaranteed), increase
         the count.  */
      if (decSignificand[partCount])
        partCount++;
    } while (p <= D.lastSigDigit);

    category = fcNormal;
    fs = roundSignificandWithExponent(decSignificand, partCount,
                                      D.exponent, rounding_mode);

    delete [] decSignificand;
  }

  return fs;
}